

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

ssize_t __thiscall TextFile::write(TextFile *this,int __fd,void *__buf,size_t __n)

{
  TextFile *pTVar1;
  undefined4 in_register_00000034;
  char *local_18;
  char *line_local;
  TextFile *this_local;
  
  local_18 = (char *)CONCAT44(in_register_00000034,__fd);
  pTVar1 = this;
  if (this->mode == Write) {
    for (; pTVar1 = (TextFile *)(ulong)(uint)(int)*local_18, (int)*local_18 != 0;
        local_18 = local_18 + 1) {
      bufPut(this,*local_18);
    }
  }
  return (ssize_t)pTVar1;
}

Assistant:

void TextFile::write(const char* line)
{
	if (mode != Write) return;

	while (*line != 0)
	{
#ifdef _WIN32
		if (*line == '\n')
			bufPut('\r');
#endif
		bufPut(*line);
		line++;
	}
}